

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptor::CopyTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  FileDescriptor *pFVar1;
  Descriptor *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_00;
  EnumDescriptor *this_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_01;
  ServiceDescriptor *this_02;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *proto_02;
  FieldDescriptor *this_03;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *proto_03;
  int i;
  int iVar2;
  int i_1;
  long lVar3;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  CopyHeadingTo(this,proto);
  for (iVar2 = 0; iVar2 < this->dependency_count_; iVar2 = iVar2 + 1) {
    pFVar1 = dependency(this,iVar2);
    local_38._M_str = (pFVar1->name_->_M_dataplus)._M_p;
    local_38._M_len = pFVar1->name_->_M_string_length;
    internal::AddToRepeatedPtrField<std::basic_string_view<char,std::char_traits<char>>>
              (&(proto->field_0)._impl_.dependency_,&local_38);
  }
  for (lVar3 = 0; lVar3 < this->public_dependency_count_; lVar3 = lVar3 + 1) {
    RepeatedField<int>::Add
              (&(proto->field_0)._impl_.public_dependency_,this->public_dependencies_[lVar3]);
  }
  for (lVar3 = 0; lVar3 < this->weak_dependency_count_; lVar3 = lVar3 + 1) {
    RepeatedField<int>::Add
              (&(proto->field_0)._impl_.weak_dependency_,this->weak_dependencies_[lVar3]);
  }
  for (iVar2 = 0; iVar2 < this->message_type_count_; iVar2 = iVar2 + 1) {
    this_00 = message_type(this,iVar2);
    proto_00 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase);
    Descriptor::CopyTo(this_00,proto_00);
  }
  for (iVar2 = 0; iVar2 < this->enum_type_count_; iVar2 = iVar2 + 1) {
    this_01 = enum_type(this,iVar2);
    proto_01 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                         (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase);
    EnumDescriptor::CopyTo(this_01,proto_01);
  }
  for (iVar2 = 0; iVar2 < this->service_count_; iVar2 = iVar2 + 1) {
    this_02 = service(this,iVar2);
    proto_02 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                         (&(proto->field_0)._impl_.service_.super_RepeatedPtrFieldBase);
    ServiceDescriptor::CopyTo(this_02,proto_02);
  }
  for (iVar2 = 0; iVar2 < this->extension_count_; iVar2 = iVar2 + 1) {
    this_03 = extension(this,iVar2);
    proto_03 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase);
    FieldDescriptor::CopyTo(this_03,proto_03);
  }
  return;
}

Assistant:

void FileDescriptor::CopyTo(FileDescriptorProto* proto) const {
  CopyHeadingTo(proto);

  for (int i = 0; i < dependency_count(); i++) {
    proto->add_dependency(dependency(i)->name());
  }

  for (int i = 0; i < public_dependency_count(); i++) {
    proto->add_public_dependency(public_dependencies_[i]);
  }

  for (int i = 0; i < weak_dependency_count(); i++) {
    proto->add_weak_dependency(weak_dependencies_[i]);
  }

  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyTo(proto->add_message_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < service_count(); i++) {
    service(i)->CopyTo(proto->add_service());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
}